

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O0

uv_os_sock_t create_udp_socket(void)

{
  int64_t eval_b_1;
  int64_t eval_a_1;
  int r;
  int yes;
  int64_t eval_b;
  int64_t eval_a;
  uv_os_sock_t sock;
  
  eval_a._4_4_ = socket(2,2,0);
  eval_b = (int64_t)eval_a._4_4_;
  _r = 0;
  if (eval_b < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-open.c"
            ,0x38,"sock",">=","0",eval_b,">=",0);
    abort();
  }
  eval_a_1._4_4_ = 1;
  eval_a_1._0_4_ = setsockopt(eval_a._4_4_,1,2,(void *)((long)&eval_a_1 + 4),4);
  if ((long)(int)eval_a_1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-open.c"
            ,0x40,"r","==","0",(long)(int)eval_a_1,"==",0);
    abort();
  }
  return eval_a._4_4_;
}

Assistant:

static uv_os_sock_t create_udp_socket(void) {
  uv_os_sock_t sock;

  sock = socket(AF_INET, SOCK_DGRAM, IPPROTO_IP);
#ifdef _WIN32
  ASSERT_NE(sock, INVALID_SOCKET);
#else
  ASSERT_GE(sock, 0);
#endif

#ifndef _WIN32
  {
    /* Allow reuse of the port. */
    int yes = 1;
    int r = setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof yes);
    ASSERT_OK(r);
  }
#endif

  return sock;
}